

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O1

void Hex::Hexdumper<unsigned_long>::output_bin(ostream *os,remove_const_t<unsigned_long> val)

{
  ostream *poVar1;
  int iVar2;
  bool bVar3;
  ostream oVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  char bits [257];
  char acStack_13a [274];
  
  uVar8 = 0;
  if (val != 0) {
    do {
      acStack_13a[uVar8 + 2] = (byte)val & 1 | 0x30;
      uVar8 = uVar8 + 1;
      bVar3 = 1 < val;
      val = val >> 1;
    } while (bVar3);
  }
  iVar7 = (int)uVar8;
  acStack_13a[(uVar8 & 0xffffffff) + 2] = '\0';
  lVar6 = *(long *)(*(long *)os + -0x18);
  poVar1 = os + lVar6;
  iVar2 = *(int *)(os + lVar6 + 0x10);
  if (os[lVar6 + 0xe1] == (ostream)0x0) {
    oVar4 = (ostream)std::ios::widen((char)poVar1);
    poVar1[0xe0] = oVar4;
    poVar1[0xe1] = (ostream)0x1;
  }
  iVar5 = iVar2 - iVar7;
  if (iVar5 == 0 || iVar2 < iVar7) {
    *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 0;
  }
  else {
    acStack_13a[1] = ' ';
    if ((char)*(undefined4 *)(poVar1 + 0xe0) != '\0') {
      acStack_13a[1] = (char)*(undefined4 *)(poVar1 + 0xe0);
    }
    *(long *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = (long)iVar5;
    std::__ostream_insert<char,std::char_traits<char>>(os,acStack_13a + 1,1);
  }
  if (0 < iVar7) {
    lVar6 = (uVar8 & 0xffffffff) + 1;
    do {
      acStack_13a[1] = acStack_13a[lVar6];
      std::__ostream_insert<char,std::char_traits<char>>(os,acStack_13a + 1,1);
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
  }
  return;
}

Assistant:

static void output_bin(std::ostream& os, std::remove_const_t<T> val)
    {
        char bits[257];
        int len = 0;
        while (val && len<256) {
            bits[len++] = (val&1) ? '1' : '0';
            val >>= 1;
        }
        bits[len] = 0;

        int width = os.width();
        char fill = os.fill();
        if (!fill) fill = ' ';
        if (width>len) {
            os << std::setw(width-len);
            os << fill;
        }
        else {
            os << std::setw(0);
        }

        for (int i=len-1 ; i>=0 ; i--)
            os << bits[i];
    }